

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

bool __thiscall
TypeFactory::setFields
          (TypeFactory *this,vector<TypeField,_std::allocator<TypeField>_> *fd,TypeStruct *ot,
          int4 fixedsize)

{
  int iVar1;
  bool bVar2;
  type_metatype tVar3;
  int4 iVar4;
  long lVar5;
  reference pTVar6;
  LowlevelError *this_00;
  TypeStruct *local_c0;
  undefined1 local_b5;
  string local_a8 [32];
  TypeStruct *local_88;
  TypeField *local_80;
  __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_> local_78;
  __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_> local_70;
  TypeField *local_68;
  int local_5c;
  Datatype *pDStack_58;
  int4 end;
  Datatype *ct;
  TypeField *local_48;
  __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_> local_40;
  iterator iter;
  int4 curalign;
  int4 cursize;
  int4 offset;
  int4 fixedsize_local;
  TypeStruct *ot_local;
  vector<TypeField,_std::allocator<TypeField>_> *fd_local;
  TypeFactory *this_local;
  
  curalign = 0;
  __gnu_cxx::__normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
  __normal_iterator(&local_40);
  local_48 = (TypeField *)std::vector<TypeField,_std::allocator<TypeField>_>::begin(fd);
  local_40._M_current = local_48;
  while( true ) {
    ct = (Datatype *)std::vector<TypeField,_std::allocator<TypeField>_>::end(fd);
    bVar2 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                        *)&ct);
    if (!bVar2) {
      local_68 = (TypeField *)std::vector<TypeField,_std::allocator<TypeField>_>::begin(fd);
      local_40._M_current = local_68;
      while( true ) {
        local_70._M_current =
             (TypeField *)std::vector<TypeField,_std::allocator<TypeField>_>::end(fd);
        bVar2 = __gnu_cxx::operator!=(&local_40,&local_70);
        if (!bVar2) break;
        pTVar6 = __gnu_cxx::
                 __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                 ::operator*(&local_40);
        if (pTVar6->offset == -1) {
          pTVar6 = __gnu_cxx::
                   __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                   ::operator*(&local_40);
          iter._M_current._4_4_ = Datatype::getSize(pTVar6->type);
          iter._M_current._0_4_ = 0;
          if (1 < this->align) {
            iVar4 = this->align;
            do {
              iter._M_current._0_4_ = iVar4;
              iVar4 = (int)(uint)iter._M_current >> 1;
            } while (iter._M_current._4_4_ <= (int)(uint)iter._M_current >> 1);
            iter._M_current._0_4_ = (uint)iter._M_current - 1;
          }
          if ((curalign & (uint)iter._M_current) != 0) {
            curalign = (curalign - (curalign & (uint)iter._M_current)) + (uint)iter._M_current + 1;
          }
          pTVar6 = __gnu_cxx::
                   __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                   ::operator*(&local_40);
          pTVar6->offset = curalign;
          curalign = iter._M_current._4_4_ + curalign;
        }
        __gnu_cxx::
        __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
        operator++(&local_40);
      }
      local_78._M_current =
           (TypeField *)std::vector<TypeField,_std::allocator<TypeField>_>::begin(fd);
      local_80 = (TypeField *)std::vector<TypeField,_std::allocator<TypeField>_>::end(fd);
      std::
      sort<__gnu_cxx::__normal_iterator<TypeField*,std::vector<TypeField,std::allocator<TypeField>>>>
                (local_78,(__normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>
                           )local_80);
      local_88 = ot;
      std::set<Datatype_*,_DatatypeCompare,_std::allocator<Datatype_*>_>::erase
                (&this->tree,(key_type *)&local_88);
      TypeStruct::setFields(ot,fd);
      if (0 < fixedsize) {
        if ((ot->super_Datatype).size < fixedsize) {
          (ot->super_Datatype).size = fixedsize;
        }
        else if (fixedsize < (ot->super_Datatype).size) {
          local_b5 = 1;
          this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
          Datatype::getName_abi_cxx11_(&ot->super_Datatype);
          std::operator+((char *)local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Trying to force too small a size on ");
          LowlevelError::LowlevelError(this_00,local_a8);
          local_b5 = 0;
          __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
      }
      local_c0 = ot;
      std::set<Datatype_*,_DatatypeCompare,_std::allocator<Datatype_*>_>::insert
                (&this->tree,(value_type *)&local_c0);
      return true;
    }
    pTVar6 = __gnu_cxx::
             __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
             operator*(&local_40);
    pDStack_58 = pTVar6->type;
    tVar3 = Datatype::getMetatype(pDStack_58);
    if (tVar3 == TYPE_VOID) break;
    __gnu_cxx::__normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
    operator*(&local_40);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 0) {
      return false;
    }
    pTVar6 = __gnu_cxx::
             __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
             operator*(&local_40);
    if (pTVar6->offset != -1) {
      pTVar6 = __gnu_cxx::
               __normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
               operator*(&local_40);
      iVar1 = pTVar6->offset;
      iVar4 = Datatype::getSize(pDStack_58);
      local_5c = iVar1 + iVar4;
      if (curalign < local_5c) {
        curalign = local_5c;
      }
    }
    __gnu_cxx::__normal_iterator<TypeField_*,_std::vector<TypeField,_std::allocator<TypeField>_>_>::
    operator++(&local_40);
  }
  return false;
}

Assistant:

bool TypeFactory::setFields(vector<TypeField> &fd,TypeStruct *ot,int4 fixedsize)

{
  int4 offset,cursize,curalign;

  offset = 0;
  vector<TypeField>::iterator iter;

  // Find the maximum offset, from the explicitly set offsets
  for(iter=fd.begin();iter!=fd.end();++iter) {
    Datatype *ct = (*iter).type;
    // Do some sanity checks on the field
    if (ct->getMetatype() == TYPE_VOID) return false;
    if ((*iter).name.size() == 0) return false;

    if ((*iter).offset != -1) {
      int4 end = (*iter).offset + ct->getSize();
      if (end > offset)
	offset = end;
    }
  }

  // Assign offsets, respecting alignment, where not explicitly set
  for(iter=fd.begin();iter!=fd.end();++iter) {
    if ((*iter).offset != -1) continue;
    cursize = (*iter).type->getSize();
    curalign = 0;
    if (align > 1) {
      curalign = align;
      while((curalign>>1) >= cursize)
	curalign >>= 1;
      curalign -= 1;
    }
    if ((offset & curalign)!=0)
      offset = (offset-(offset & curalign) + (curalign+1));
    (*iter).offset = offset;
    offset += cursize;
  }

  sort(fd.begin(),fd.end());	// Sort fields by offset

  // We could check field overlapping here

  tree.erase(ot);
  ot->setFields(fd);
  if (fixedsize > 0) {		// If the caller is trying to force a size
    if (fixedsize > ot->size)	// If the forced size is bigger than the size required for fields
      ot->size = fixedsize;	//     Force the bigger size
    else if (fixedsize < ot->size) // If the forced size is smaller, this is an error
      throw LowlevelError("Trying to force too small a size on "+ot->getName());
  }
  tree.insert(ot);
  return true;
}